

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O3

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  void *pvVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  undefined4 uVar20;
  void *unaff_R14;
  void *pvVar21;
  bool bVar22;
  float fVar23;
  int iVar26;
  undefined1 auVar24 [16];
  int iVar27;
  undefined1 auVar25 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  undefined1 auVar35 [16];
  void *local_128;
  void *local_f8;
  Mat local_e8;
  long local_a0;
  Mat local_98;
  void *local_48;
  long local_40;
  long local_38;
  
  uVar1 = bottom_top_blob->dims;
  sVar2 = bottom_top_blob->elemsize;
  iVar17 = (this->axis >> 0x1f & uVar1) + this->axis;
  if (uVar1 == 1) {
    iVar26 = bottom_top_blob->w;
    lVar16 = (long)iVar26;
    if (0 < lVar16) {
      unaff_R14 = bottom_top_blob->data;
      auVar28._0_12_ = ZEXT812(0xff7fffff);
      auVar28._12_4_ = 0;
      lVar8 = 0;
      do {
        fVar31 = *(float *)((long)unaff_R14 + lVar8 * 4);
        if (auVar28._0_4_ <= fVar31) {
          auVar28._0_4_ = fVar31;
        }
        lVar8 = lVar8 + 1;
      } while (lVar16 != lVar8);
      if (0 < iVar26) {
        fVar31 = 0.0;
        lVar8 = 0;
        do {
          fVar23 = expf(*(float *)((long)unaff_R14 + lVar8 * 4) - auVar28._0_4_);
          auVar28 = ZEXT416((uint)auVar28._0_4_);
          *(float *)((long)unaff_R14 + lVar8 * 4) = fVar23;
          fVar31 = fVar31 + fVar23;
          lVar8 = lVar8 + 1;
        } while (lVar16 != lVar8);
        if (0 < iVar26) {
          lVar8 = 0;
          do {
            *(float *)((long)unaff_R14 + lVar8 * 4) =
                 *(float *)((long)unaff_R14 + lVar8 * 4) * (1.0 / fVar31);
            lVar8 = lVar8 + 1;
          } while (lVar16 != lVar8);
        }
      }
      goto LAB_0033c60b;
    }
    uVar20 = 0;
  }
  else {
LAB_0033c60b:
    uVar20 = (undefined4)CONCAT71((int7)((ulong)unaff_R14 >> 8),uVar1 == 2);
    if ((uVar1 == 2) && (iVar17 == 0)) {
      uVar13 = bottom_top_blob->w;
      uVar11 = (ulong)uVar13;
      uVar7 = bottom_top_blob->h;
      uVar9 = (ulong)uVar7;
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.allocator = (Allocator *)0x0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      Mat::create(&local_e8,uVar13,sVar2,opt->workspace_allocator);
      auVar30 = _DAT_00552360;
      auVar29 = _DAT_00552350;
      auVar28 = _DAT_00552250;
      if ((local_e8.data == (void *)0x0) || (local_e8.cstep * (long)local_e8.c == 0)) {
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 != 0) {
          return -100;
        }
        if (local_e8.allocator != (Allocator *)0x0) {
          (*(local_e8.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_0033d2d6;
      }
      uVar12 = (int)local_e8.cstep * local_e8.c;
      if (0 < (int)uVar12) {
        lVar16 = (ulong)uVar12 - 1;
        auVar24._8_4_ = (int)lVar16;
        auVar24._0_8_ = lVar16;
        auVar24._12_4_ = (int)((ulong)lVar16 >> 0x20);
        uVar15 = 0;
        auVar24 = auVar24 ^ _DAT_00552250;
        do {
          auVar32._8_4_ = (int)uVar15;
          auVar32._0_8_ = uVar15;
          auVar32._12_4_ = (int)(uVar15 >> 0x20);
          auVar35 = (auVar32 | auVar30) ^ auVar28;
          iVar26 = auVar24._4_4_;
          if ((bool)(~(iVar26 < auVar35._4_4_ ||
                      auVar24._0_4_ < auVar35._0_4_ && auVar35._4_4_ == iVar26) & 1)) {
            *(undefined4 *)((long)local_e8.data + uVar15 * 4) = 0xff7fffff;
          }
          if (auVar35._12_4_ <= auVar24._12_4_ &&
              (auVar35._8_4_ <= auVar24._8_4_ || auVar35._12_4_ != auVar24._12_4_)) {
            *(undefined4 *)((long)local_e8.data + uVar15 * 4 + 4) = 0xff7fffff;
          }
          auVar32 = (auVar32 | auVar29) ^ auVar28;
          iVar19 = auVar32._4_4_;
          if (iVar19 <= iVar26 && (iVar19 != iVar26 || auVar32._0_4_ <= auVar24._0_4_)) {
            *(undefined4 *)((long)local_e8.data + uVar15 * 4 + 8) = 0xff7fffff;
            *(undefined4 *)((long)local_e8.data + uVar15 * 4 + 0xc) = 0xff7fffff;
          }
          uVar15 = uVar15 + 4;
        } while ((uVar12 + 3 & 0xfffffffc) != uVar15);
      }
      if (0 < (int)uVar7) {
        pvVar14 = bottom_top_blob->data;
        iVar26 = bottom_top_blob->w;
        sVar3 = bottom_top_blob->elemsize;
        uVar15 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar18 = 0;
            do {
              fVar23 = *(float *)((long)pvVar14 + uVar18 * 4);
              fVar31 = *(float *)((long)local_e8.data + uVar18 * 4);
              if (fVar23 <= fVar31) {
                fVar23 = fVar31;
              }
              *(float *)((long)local_e8.data + uVar18 * 4) = fVar23;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          uVar15 = uVar15 + 1;
          pvVar14 = (void *)((long)pvVar14 + (long)iVar26 * sVar3);
        } while (uVar15 != uVar9);
      }
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      Mat::create(&local_98,uVar13,sVar2,opt->workspace_allocator);
      pvVar14 = local_98.data;
      bVar22 = true;
      if ((local_98.data != (void *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
        uVar12 = (int)local_98.cstep * local_98.c;
        if (0 < (int)uVar12) {
          memset(local_98.data,0,(ulong)uVar12 << 2);
        }
        pvVar10 = local_e8.data;
        if (0 < (int)uVar7) {
          local_a0 = CONCAT44(local_a0._4_4_,uVar20);
          pvVar21 = bottom_top_blob->data;
          iVar26 = bottom_top_blob->w;
          sVar3 = bottom_top_blob->elemsize;
          uVar15 = 0;
          do {
            if (0 < (int)uVar13) {
              uVar18 = 0;
              do {
                fVar31 = expf(*(float *)((long)pvVar21 + uVar18 * 4) -
                              *(float *)((long)pvVar10 + uVar18 * 4));
                *(float *)((long)pvVar21 + uVar18 * 4) = fVar31;
                *(float *)((long)pvVar14 + uVar18 * 4) =
                     fVar31 + *(float *)((long)pvVar14 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar15 = uVar15 + 1;
            pvVar21 = (void *)((long)pvVar21 + (long)iVar26 * sVar3);
          } while (uVar15 != uVar9);
          uVar20 = (undefined4)local_a0;
          if ((int)uVar7 < 1) {
            bVar22 = false;
            goto LAB_0033c992;
          }
          pvVar10 = bottom_top_blob->data;
          iVar26 = bottom_top_blob->w;
          sVar3 = bottom_top_blob->elemsize;
          uVar15 = 0;
          do {
            if (0 < (int)uVar13) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar10 + uVar18 * 4) =
                     *(float *)((long)pvVar10 + uVar18 * 4) / *(float *)((long)pvVar14 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            uVar15 = uVar15 + 1;
            pvVar10 = (void *)((long)pvVar10 + (long)iVar26 * sVar3);
          } while (uVar15 != uVar9);
        }
        bVar22 = false;
      }
LAB_0033c992:
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (bVar22) {
        return -100;
      }
    }
  }
  if (((char)uVar20 == '\0') || (iVar17 != 1)) {
LAB_0033caf7:
    bVar22 = uVar1 == 3;
    if (iVar17 == 0 && bVar22) {
      iVar26 = bottom_top_blob->w;
      iVar19 = bottom_top_blob->h;
      uVar1 = bottom_top_blob->c;
      uVar9 = (ulong)uVar1;
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize._0_4_ = 0;
      local_e8.elemsize._4_4_ = 0;
      local_e8.elempack = 0;
      local_e8.allocator = (Allocator *)0x0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      Mat::create(&local_e8,iVar26,iVar19,sVar2,opt->workspace_allocator);
      auVar30 = _DAT_00552360;
      auVar29 = _DAT_00552350;
      auVar28 = _DAT_00552250;
      if ((local_e8.data == (void *)0x0) || (local_e8.cstep * (long)local_e8.c == 0)) {
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 != 0) {
          return -100;
        }
        if (local_e8.allocator != (Allocator *)0x0) {
          (*(local_e8.allocator)->_vptr_Allocator[3])();
          return -100;
        }
        goto LAB_0033d2d6;
      }
      uVar13 = (int)local_e8.cstep * local_e8.c;
      if (0 < (int)uVar13) {
        lVar16 = (ulong)uVar13 - 1;
        auVar35._8_4_ = (int)lVar16;
        auVar35._0_8_ = lVar16;
        auVar35._12_4_ = (int)((ulong)lVar16 >> 0x20);
        uVar11 = 0;
        auVar35 = auVar35 ^ _DAT_00552250;
        do {
          auVar33._8_4_ = (int)uVar11;
          auVar33._0_8_ = uVar11;
          auVar33._12_4_ = (int)(uVar11 >> 0x20);
          auVar24 = (auVar33 | auVar30) ^ auVar28;
          iVar27 = auVar35._4_4_;
          if ((bool)(~(iVar27 < auVar24._4_4_ ||
                      auVar35._0_4_ < auVar24._0_4_ && auVar24._4_4_ == iVar27) & 1)) {
            *(undefined4 *)((long)local_e8.data + uVar11 * 4) = 0xff7fffff;
          }
          if (auVar24._12_4_ <= auVar35._12_4_ &&
              (auVar24._8_4_ <= auVar35._8_4_ || auVar24._12_4_ != auVar35._12_4_)) {
            *(undefined4 *)((long)local_e8.data + uVar11 * 4 + 4) = 0xff7fffff;
          }
          auVar24 = (auVar33 | auVar29) ^ auVar28;
          iVar36 = auVar24._4_4_;
          if (iVar36 <= iVar27 && (iVar36 != iVar27 || auVar24._0_4_ <= auVar35._0_4_)) {
            *(undefined4 *)((long)local_e8.data + uVar11 * 4 + 8) = 0xff7fffff;
            *(undefined4 *)((long)local_e8.data + uVar11 * 4 + 0xc) = 0xff7fffff;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar13 + 3 & 0xfffffffc) != uVar11);
      }
      uVar13 = iVar19 * iVar26;
      if (0 < (int)uVar1) {
        sVar3 = bottom_top_blob->cstep;
        sVar4 = bottom_top_blob->elemsize;
        pvVar14 = bottom_top_blob->data;
        uVar11 = 0;
        do {
          if (0 < (int)uVar13) {
            uVar15 = 0;
            do {
              fVar23 = *(float *)((long)pvVar14 + uVar15 * 4);
              fVar31 = *(float *)((long)local_e8.data + uVar15 * 4);
              if (fVar23 <= fVar31) {
                fVar23 = fVar31;
              }
              *(float *)((long)local_e8.data + uVar15 * 4) = fVar23;
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
          }
          uVar11 = uVar11 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
        } while (uVar11 != uVar9);
      }
      local_98.cstep = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.d = 0;
      local_98.c = 0;
      Mat::create(&local_98,iVar26,iVar19,sVar2,opt->workspace_allocator);
      bVar6 = true;
      if ((local_98.data != (void *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
        uVar7 = (int)local_98.cstep * local_98.c;
        if (0 < (int)uVar7) {
          memset(local_98.data,0,(ulong)uVar7 << 2);
        }
        pvVar10 = local_98.data;
        pvVar14 = local_e8.data;
        if ((int)uVar1 < 1) {
          bVar6 = false;
        }
        else {
          pvVar21 = bottom_top_blob->data;
          sVar3 = bottom_top_blob->cstep;
          sVar4 = bottom_top_blob->elemsize;
          uVar11 = 0;
          do {
            if (0 < (int)uVar13) {
              uVar15 = 0;
              do {
                fVar31 = expf(*(float *)((long)pvVar21 + uVar15 * 4) -
                              *(float *)((long)pvVar14 + uVar15 * 4));
                *(float *)((long)pvVar21 + uVar15 * 4) = fVar31;
                *(float *)((long)pvVar10 + uVar15 * 4) =
                     fVar31 + *(float *)((long)pvVar10 + uVar15 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar13 != uVar15);
            }
            uVar11 = uVar11 + 1;
            pvVar21 = (void *)((long)pvVar21 + sVar3 * sVar4);
          } while (uVar11 != uVar9);
          if (0 < (int)uVar1) {
            pvVar14 = bottom_top_blob->data;
            sVar3 = bottom_top_blob->cstep;
            sVar4 = bottom_top_blob->elemsize;
            uVar11 = 0;
            do {
              if (0 < (int)uVar13) {
                uVar15 = 0;
                do {
                  *(float *)((long)pvVar14 + uVar15 * 4) =
                       *(float *)((long)pvVar14 + uVar15 * 4) /
                       *(float *)((long)local_98.data + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar13 != uVar15);
              }
              uVar11 = uVar11 + 1;
              pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
            } while (uVar11 != uVar9);
          }
          bVar6 = false;
        }
      }
      piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            if (local_e8.data != (void *)0x0) {
              free(local_e8.data);
            }
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (bVar6) {
        return -100;
      }
    }
  }
  else {
    iVar26 = bottom_top_blob->h;
    if (0 < (long)iVar26) {
      uVar13 = bottom_top_blob->w;
      uVar9 = (ulong)uVar13;
      sVar3 = bottom_top_blob->elemsize;
      pvVar14 = bottom_top_blob->data;
      lVar16 = 0;
      do {
        if (0 < (int)uVar13) {
          uVar11 = 0;
          auVar29._0_12_ = ZEXT812(0xff7fffff);
          auVar29._12_4_ = 0;
          do {
            fVar31 = *(float *)((long)pvVar14 + uVar11 * 4);
            if (auVar29._0_4_ <= fVar31) {
              auVar29._0_4_ = fVar31;
            }
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
          if (0 < (int)uVar13) {
            fVar31 = 0.0;
            uVar11 = 0;
            do {
              fVar23 = expf(*(float *)((long)pvVar14 + uVar11 * 4) - auVar29._0_4_);
              auVar29 = ZEXT416((uint)auVar29._0_4_);
              *(float *)((long)pvVar14 + uVar11 * 4) = fVar23;
              fVar31 = fVar31 + fVar23;
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
            if (0 < (int)uVar13) {
              uVar11 = 0;
              do {
                *(float *)((long)pvVar14 + uVar11 * 4) =
                     *(float *)((long)pvVar14 + uVar11 * 4) * (1.0 / fVar31);
                uVar11 = uVar11 + 1;
              } while (uVar9 != uVar11);
            }
          }
        }
        lVar16 = lVar16 + 1;
        pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar13 * sVar3);
      } while (lVar16 != iVar26);
      goto LAB_0033caf7;
    }
    bVar22 = false;
  }
  if ((!bVar22) || (iVar17 != 1)) goto LAB_0033d41d;
  uVar1 = bottom_top_blob->w;
  uVar11 = (ulong)uVar1;
  iVar26 = bottom_top_blob->h;
  uVar13 = bottom_top_blob->c;
  uVar9 = (ulong)uVar13;
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,uVar1,uVar13,sVar2,opt->workspace_allocator);
  auVar30 = _DAT_00552360;
  auVar29 = _DAT_00552350;
  auVar28 = _DAT_00552250;
  if ((local_e8.data == (void *)0x0) || (local_e8.cstep * (long)local_e8.c == 0)) {
    piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return -100;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return -100;
    }
    if (local_e8.allocator != (Allocator *)0x0) {
      (*(local_e8.allocator)->_vptr_Allocator[3])();
      return -100;
    }
LAB_0033d2d6:
    if (local_e8.data != (void *)0x0) {
      free(local_e8.data);
    }
    return -100;
  }
  uVar7 = (int)local_e8.cstep * local_e8.c;
  if (0 < (int)uVar7) {
    lVar16 = (ulong)uVar7 - 1;
    auVar25._8_4_ = (int)lVar16;
    auVar25._0_8_ = lVar16;
    auVar25._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar15 = 0;
    auVar25 = auVar25 ^ _DAT_00552250;
    do {
      auVar34._8_4_ = (int)uVar15;
      auVar34._0_8_ = uVar15;
      auVar34._12_4_ = (int)(uVar15 >> 0x20);
      auVar24 = (auVar34 | auVar30) ^ auVar28;
      iVar19 = auVar25._4_4_;
      if ((bool)(~(auVar24._4_4_ == iVar19 && auVar25._0_4_ < auVar24._0_4_ ||
                  iVar19 < auVar24._4_4_) & 1)) {
        *(undefined4 *)((long)local_e8.data + uVar15 * 4) = 0xff7fffff;
      }
      if ((auVar24._12_4_ != auVar25._12_4_ || auVar24._8_4_ <= auVar25._8_4_) &&
          auVar24._12_4_ <= auVar25._12_4_) {
        *(undefined4 *)((long)local_e8.data + uVar15 * 4 + 4) = 0xff7fffff;
      }
      auVar24 = (auVar34 | auVar29) ^ auVar28;
      iVar27 = auVar24._4_4_;
      if (iVar27 <= iVar19 && (iVar27 != iVar19 || auVar24._0_4_ <= auVar25._0_4_)) {
        *(undefined4 *)((long)local_e8.data + uVar15 * 4 + 8) = 0xff7fffff;
        *(undefined4 *)((long)local_e8.data + uVar15 * 4 + 0xc) = 0xff7fffff;
      }
      uVar15 = uVar15 + 4;
    } while ((uVar7 + 3 & 0xfffffffc) != uVar15);
  }
  if (0 < (int)uVar13) {
    pvVar14 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    uVar15 = 0;
    pvVar10 = local_e8.data;
    do {
      if (0 < iVar26) {
        iVar19 = 0;
        pvVar21 = pvVar14;
        do {
          if (0 < (int)uVar1) {
            uVar18 = 0;
            do {
              fVar23 = *(float *)((long)pvVar21 + uVar18 * 4);
              fVar31 = *(float *)((long)pvVar10 + uVar18 * 4);
              if (fVar23 <= fVar31) {
                fVar23 = fVar31;
              }
              *(float *)((long)pvVar10 + uVar18 * 4) = fVar23;
              uVar18 = uVar18 + 1;
            } while (uVar11 != uVar18);
          }
          iVar19 = iVar19 + 1;
          pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar1 * 4);
        } while (iVar19 != iVar26);
      }
      uVar15 = uVar15 + 1;
      pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
      pvVar10 = (void *)((long)pvVar10 +
                        (long)local_e8.w *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    } while (uVar15 != uVar9);
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  Mat::create(&local_98,uVar1,uVar13,sVar2,opt->workspace_allocator);
  pvVar14 = local_98.data;
  bVar6 = true;
  if ((local_98.data != (void *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
    uVar7 = (int)local_98.cstep * local_98.c;
    if (0 < (int)uVar7) {
      memset(local_98.data,0,(ulong)uVar7 << 2);
    }
    if (0 < (int)uVar13) {
      local_f8 = bottom_top_blob->data;
      local_40 = (long)local_98.w * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
      local_38 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      local_a0 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      lVar16 = (long)(int)uVar1 * 4;
      uVar15 = 0;
      local_48 = pvVar14;
      pvVar10 = local_e8.data;
      do {
        if (0 < iVar26) {
          iVar19 = 0;
          pvVar21 = local_f8;
          do {
            if (0 < (int)uVar1) {
              uVar18 = 0;
              do {
                fVar31 = expf(*(float *)((long)pvVar21 + uVar18 * 4) -
                              *(float *)((long)pvVar10 + uVar18 * 4));
                *(float *)((long)pvVar21 + uVar18 * 4) = fVar31;
                *(float *)((long)pvVar14 + uVar18 * 4) =
                     fVar31 + *(float *)((long)pvVar14 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            iVar19 = iVar19 + 1;
            pvVar21 = (void *)((long)pvVar21 + lVar16);
          } while (iVar19 != iVar26);
        }
        uVar15 = uVar15 + 1;
        pvVar14 = (void *)((long)pvVar14 + local_40);
        pvVar10 = (void *)((long)pvVar10 + local_38);
        local_f8 = (void *)((long)local_f8 + local_a0);
      } while (uVar15 != uVar9);
      if ((int)uVar13 < 1) {
        bVar6 = false;
        goto LAB_0033d3a0;
      }
      pvVar14 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->cstep;
      sVar3 = bottom_top_blob->elemsize;
      uVar15 = 0;
      pvVar10 = local_48;
      do {
        if (0 < iVar26) {
          iVar19 = 0;
          pvVar21 = pvVar14;
          do {
            if (0 < (int)uVar1) {
              uVar18 = 0;
              do {
                *(float *)((long)pvVar21 + uVar18 * 4) =
                     *(float *)((long)pvVar21 + uVar18 * 4) / *(float *)((long)pvVar10 + uVar18 * 4)
                ;
                uVar18 = uVar18 + 1;
              } while (uVar11 != uVar18);
            }
            iVar19 = iVar19 + 1;
            pvVar21 = (void *)((long)pvVar21 + lVar16);
          } while (iVar19 != iVar26);
        }
        uVar15 = uVar15 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
        pvVar10 = (void *)((long)pvVar10 +
                          (long)local_98.w *
                          CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
      } while (uVar15 != uVar9);
    }
    bVar6 = false;
  }
LAB_0033d3a0:
  piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (bVar6) {
    return -100;
  }
LAB_0033d41d:
  if (!(bool)(bVar22 & iVar17 == 2)) {
    return 0;
  }
  iVar17 = bottom_top_blob->c;
  if (0 < (long)iVar17) {
    iVar26 = bottom_top_blob->h;
    uVar1 = bottom_top_blob->w;
    uVar9 = (ulong)uVar1;
    local_128 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    lVar16 = 0;
    do {
      if (0 < iVar26) {
        iVar19 = 0;
        pvVar14 = local_128;
        do {
          if (0 < (int)uVar1) {
            uVar11 = 0;
            auVar30._0_12_ = ZEXT812(0xff7fffff);
            auVar30._12_4_ = 0;
            do {
              fVar31 = *(float *)((long)pvVar14 + uVar11 * 4);
              if (auVar30._0_4_ <= fVar31) {
                auVar30._0_4_ = fVar31;
              }
              uVar11 = uVar11 + 1;
            } while (uVar9 != uVar11);
            if (0 < (int)uVar1) {
              fVar31 = 0.0;
              uVar11 = 0;
              do {
                fVar23 = expf(*(float *)((long)pvVar14 + uVar11 * 4) - auVar30._0_4_);
                auVar30 = ZEXT416((uint)auVar30._0_4_);
                *(float *)((long)pvVar14 + uVar11 * 4) = fVar23;
                fVar31 = fVar31 + fVar23;
                uVar11 = uVar11 + 1;
              } while (uVar9 != uVar11);
              if (0 < (int)uVar1) {
                uVar11 = 0;
                do {
                  *(float *)((long)pvVar14 + uVar11 * 4) =
                       *(float *)((long)pvVar14 + uVar11 * 4) * (1.0 / fVar31);
                  uVar11 = uVar11 + 1;
                } while (uVar9 != uVar11);
              }
            }
          }
          iVar19 = iVar19 + 1;
          pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar1 * 4);
        } while (iVar19 != iVar26);
      }
      lVar16 = lVar16 + 1;
      local_128 = (void *)((long)local_128 + sVar2 * sVar3);
    } while (lVar16 != iVar17);
    return 0;
  }
  return 0;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = expf( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i = 0; i < w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i = 0; i < w; i++)
        {
            ptr[i] = expf(ptr[i] - max);
            sum += ptr[i];
        }

        for (int i = 0; i < w; i++)
        {
            ptr[i] /= sum;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] = expf(ptr[j] - max[j]);
                sum[j] += ptr[j];
            }
        }

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] /= sum[j];
            }
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j = 0; j < w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j = 0; j < w; j++)
            {
                ptr[j] = expf(ptr[j] - m);
                s += ptr[j];
            }

            for (int j = 0; j < w; j++)
            {
                ptr[j] /= s;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = expf(ptr[i] - max[i]);
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] /= sum[i];
            }
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = expf(ptr[j] - maxptr[j]);
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                float max = -FLT_MAX;
                for (int j = 0; j < w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = expf(ptr[j] - max);
                    sum += ptr[j];
                }

                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }
    }

    return 0;
}